

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O3

void libtorrent::find_ip_address(int type,string_view string,ip_address_parse_state *state)

{
  undefined4 uVar1;
  undefined4 in_register_0000003c;
  error_code_parse_state *in_R8;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  string_view string_00;
  
  string_00._M_len = string._M_str;
  string_00._M_str = (char *)state;
  find_error_code((libtorrent *)CONCAT44(in_register_0000003c,type),(int)string._M_len,string_00,
                  in_R8);
  if ((state->super_error_code_parse_state).exit == false) {
    if (type == 4) {
      if (state->in_ip_address == true) {
        ::std::__cxx11::string::replace
                  ((ulong)&state->ip_address,0,(char *)(state->ip_address)._M_string_length,
                   (ulong)string_00._M_len);
        (state->super_error_code_parse_state).exit = true;
      }
    }
    else if ((type == 0) && (string._M_len == 0x14)) {
      uVar1 = *(undefined4 *)(string_00._M_len + 0x10);
      auVar3[0] = -((char)uVar1 == 'r');
      auVar3[1] = -((char)((uint)uVar1 >> 8) == 'e');
      auVar3[2] = -((char)((uint)uVar1 >> 0x10) == 's');
      auVar3[3] = -((char)((uint)uVar1 >> 0x18) == 's');
      auVar3[4] = 0xff;
      auVar3[5] = 0xff;
      auVar3[6] = 0xff;
      auVar3[7] = 0xff;
      auVar3[8] = 0xff;
      auVar3[9] = 0xff;
      auVar3[10] = 0xff;
      auVar3[0xb] = 0xff;
      auVar3[0xc] = 0xff;
      auVar3[0xd] = 0xff;
      auVar3[0xe] = 0xff;
      auVar3[0xf] = 0xff;
      auVar2[0] = -(*string_00._M_len == 'N');
      auVar2[1] = -(string_00._M_len[1] == 'e');
      auVar2[2] = -(string_00._M_len[2] == 'w');
      auVar2[3] = -(string_00._M_len[3] == 'E');
      auVar2[4] = -(string_00._M_len[4] == 'x');
      auVar2[5] = -(string_00._M_len[5] == 't');
      auVar2[6] = -(string_00._M_len[6] == 'e');
      auVar2[7] = -(string_00._M_len[7] == 'r');
      auVar2[8] = -(string_00._M_len[8] == 'n');
      auVar2[9] = -(string_00._M_len[9] == 'a');
      auVar2[10] = -(string_00._M_len[10] == 'l');
      auVar2[0xb] = -(string_00._M_len[0xb] == 'I');
      auVar2[0xc] = -(string_00._M_len[0xc] == 'P');
      auVar2[0xd] = -(string_00._M_len[0xd] == 'A');
      auVar2[0xe] = -(string_00._M_len[0xe] == 'd');
      auVar2[0xf] = -(string_00._M_len[0xf] == 'd');
      auVar2 = auVar2 & auVar3;
      if ((ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar2[0xf] >> 7) << 0xf) == 0xffff) {
        state->in_ip_address = true;
      }
    }
  }
  return;
}

Assistant:

void find_ip_address(int const type, string_view string, ip_address_parse_state& state)
{
	find_error_code(type, string, state);
	if (state.exit) return;

	if (type == xml_start_tag && string == "NewExternalIPAddress")
	{
		state.in_ip_address = true;
	}
	else if (type == xml_string && state.in_ip_address)
	{
		state.ip_address.assign(string.begin(), string.end());
		state.exit = true;
	}
}